

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O0

Var Js::GlobalObject::EntryChWriteTraceEvent(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  ScriptContext *pSVar3;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar4;
  JavascriptLibrary *pJVar5;
  undefined1 local_48 [8];
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar3 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar3);
  pSVar3 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar3,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x628,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ArgumentReader::ArgumentReader((ArgumentReader *)local_48,(CallInfo *)&function_local,values);
  if ((local_48._0_4_ & 0xffffff) < 2) {
    pSVar3 = RecyclableObject::GetScriptContext(function);
    pJVar5 = ScriptContext::GetLibrary(pSVar3);
    callInfo_local =
         (CallInfo)JavascriptLibraryBase::GetUndefined(&pJVar5->super_JavascriptLibraryBase);
  }
  else {
    pSVar3 = RecyclableObject::GetScriptContext(function);
    pJVar5 = ScriptContext::GetLibrary(pSVar3);
    callInfo_local =
         (CallInfo)JavascriptLibraryBase::GetUndefined(&pJVar5->super_JavascriptLibraryBase);
  }
  return (Var)callInfo_local;
}

Assistant:

Var GlobalObject::EntryChWriteTraceEvent(RecyclableObject *function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);

        if (args.Info.Count < 2)
        {
            return function->GetScriptContext()->GetLibrary()->GetUndefined();
        }

        JS_ETW(EventWriteJSCRIPT_INTERNAL_GENERIC_EVENT(Js::JavascriptConversion::ToString(args[1], function->GetScriptContext())->GetSz()));
        return function->GetScriptContext()->GetLibrary()->GetUndefined();
    }